

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
PA4Application::RenderObject::makeCheckerBoard(void)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  iterator iVar1;
  iterator iVar2;
  vector<unsigned_char,std::allocator<unsigned_char>> *in_RDI;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_168;
  const_iterator local_160;
  uchar *local_158;
  uchar local_14c [4];
  iterator local_148;
  undefined8 local_140;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  const_iterator local_130;
  uchar *local_128;
  uchar local_11c [4];
  iterator local_118;
  undefined8 local_110;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_108;
  const_iterator local_100;
  uint local_f4;
  undefined1 local_f0 [4];
  uint j_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> row_1;
  uint k_1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  const_iterator local_b0;
  uchar *local_a8;
  uchar local_9c [4];
  iterator local_98;
  undefined8 local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  const_iterator local_80;
  uchar *local_78;
  uchar local_5c [4];
  iterator local_58;
  undefined8 local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  const_iterator local_40;
  uint local_34;
  undefined1 local_30 [4];
  uint j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> row;
  uint k;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *checkerboard;
  
  row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  for (row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (uint)row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < 10;
      row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
      local_48._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_40,&local_48);
      local_5c[0] = 0xff;
      local_5c[1] = 0;
      local_5c[2] = 0;
      local_5c[3] = 0xff;
      local_58 = local_5c;
      local_50 = 4;
      __l_02._M_len = 4;
      __l_02._M_array = local_58;
      local_78 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_30,local_40,__l_02);
      local_88._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_80,&local_88);
      local_9c[0] = '\0';
      local_9c[1] = 0xff;
      local_9c[2] = 0;
      local_9c[3] = 0xff;
      local_98 = local_9c;
      local_90 = 4;
      __l_01._M_len = 4;
      __l_01._M_array = local_98;
      local_a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_30,local_80,__l_01);
    }
    local_b8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_b0,&local_b8);
    iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_RDI,local_b0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )iVar1._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )iVar2._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  }
  for (row_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      row_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 10;
      row_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           row_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
    for (local_f4 = 0; local_f4 < 10; local_f4 = local_f4 + 1) {
      local_108._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_100,&local_108);
      local_11c[0] = '\0';
      local_11c[1] = 0xff;
      local_11c[2] = 0;
      local_11c[3] = 0xff;
      local_118 = local_11c;
      local_110 = 4;
      __l_00._M_len = 4;
      __l_00._M_array = local_118;
      local_128 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_f0,local_100,__l_00);
      local_138._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_130,&local_138);
      local_14c[0] = '\0';
      local_14c[1] = 0;
      local_14c[2] = 0xff;
      local_14c[3] = 0xff;
      local_148 = local_14c;
      local_140 = 4;
      __l._M_len = 4;
      __l._M_array = local_148;
      local_158 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_f0,local_130,__l);
    }
    local_168._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_160,&local_168);
    iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
    iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_RDI,local_160,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )iVar1._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )iVar2._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<GLubyte> PA4Application::RenderObject::makeCheckerBoard()
{
  std::vector<GLubyte> checkerboard;
  for (uint k = 0; k < 10; ++k) {
    std::vector<GLubyte> row;
    for (uint j = 0; j < 10; ++j) {
      row.insert(row.begin(), {255, 0, 0, 255});
      row.insert(row.end(), {0, 255, 0, 255});
    }
    checkerboard.insert(checkerboard.end(), row.begin(), row.end());
  }
  for (uint k = 0; k < 10; ++k) {
    std::vector<GLubyte> row;
    for (uint j = 0; j < 10; ++j) {
      row.insert(row.begin(), {0, 255, 0, 255});
      row.insert(row.end(), {0, 0, 255, 255});
    }
    checkerboard.insert(checkerboard.end(), row.begin(), row.end());
  }
  return checkerboard;
}